

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_controller.cpp
# Opt level: O0

uint64_t __thiscall
r_exec::HLPController::get_requirement_count
          (HLPController *this,uint64_t *weak_requirement_count,uint64_t *strong_requirement_count)

{
  mutex_type *pmVar1;
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> guard;
  uint64_t r_c;
  uint64_t *strong_requirement_count_local;
  uint64_t *weak_requirement_count_local;
  HLPController *this_local;
  
  std::lock_guard<std::mutex>::lock_guard
            (&local_30,&(this->super_OController).super_Controller.m_reductionMutex);
  pmVar1 = (mutex_type *)this->requirement_count;
  *weak_requirement_count = this->weak_requirement_count;
  *strong_requirement_count = this->strong_requirement_count;
  guard._M_device = pmVar1;
  std::lock_guard<std::mutex>::~lock_guard(&local_30);
  return (uint64_t)pmVar1;
}

Assistant:

uint64_t HLPController::get_requirement_count(uint64_t &weak_requirement_count, uint64_t &strong_requirement_count)
{
    uint64_t r_c;
    std::lock_guard<std::mutex> guard(m_reductionMutex);
    r_c = requirement_count;
    weak_requirement_count = this->weak_requirement_count;
    strong_requirement_count = this->strong_requirement_count;
    return r_c;
}